

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring64map.hh
# Opt level: O3

Roaring64Map * roaring::Roaring64Map::bitmapOf(Roaring64Map *__return_storage_ptr__,size_t n,...)

{
  _Rb_tree_header *p_Var1;
  char in_AL;
  void **ppvVar2;
  uint uVar3;
  undefined8 in_RCX;
  ulong uVar4;
  undefined8 in_RDX;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined4 in_XMM0_Da;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list vl;
  void **local_e0;
  void *local_c8 [4];
  undefined8 local_a8;
  undefined8 local_a0;
  undefined4 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  undefined8 local_38;
  undefined8 local_28;
  
  if (in_AL != '\0') {
    local_98 = in_XMM0_Da;
    local_88 = in_XMM1_Qa;
    local_78 = in_XMM2_Qa;
    local_68 = in_XMM3_Qa;
    local_58 = in_XMM4_Qa;
    local_48 = in_XMM5_Qa;
    local_38 = in_XMM6_Qa;
    local_28 = in_XMM7_Qa;
  }
  p_Var1 = &(__return_storage_ptr__->roarings)._M_t._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->roarings)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  *(undefined8 *)&(__return_storage_ptr__->roarings)._M_t._M_impl = 0;
  *(undefined8 *)&(__return_storage_ptr__->roarings)._M_t._M_impl.super__Rb_tree_header._M_header =
       0;
  (__return_storage_ptr__->roarings)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (__return_storage_ptr__->roarings)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (__return_storage_ptr__->roarings)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  __return_storage_ptr__->copyOnWrite = false;
  local_e0 = &vl[0].overflow_arg_area;
  uVar3 = 0x10;
  local_c8[2] = (void *)in_RDX;
  local_c8[3] = (void *)in_RCX;
  local_a8 = in_R8;
  local_a0 = in_R9;
  if (n != 0) {
    do {
      uVar4 = (ulong)uVar3;
      if (uVar4 < 0x29) {
        uVar3 = uVar3 + 8;
        ppvVar2 = (void **)((long)local_c8 + uVar4);
      }
      else {
        ppvVar2 = local_e0;
        local_e0 = local_e0 + 1;
      }
      add(__return_storage_ptr__,(uint64_t)*ppvVar2);
      n = n - 1;
    } while (n != 0);
  }
  return __return_storage_ptr__;
}

Assistant:

static Roaring64Map bitmapOf(size_t n...) {
        Roaring64Map ans;
        va_list vl;
        va_start(vl, n);
        for (size_t i = 0; i < n; i++) {
            ans.add(va_arg(vl, uint64_t));
        }
        va_end(vl);
        return ans;
    }